

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_filter.c
# Opt level: O3

void d_filter_setup(void)

{
  sighip_setup();
  siglop_setup();
  sigbp_setup();
  sigbiquad_setup();
  sigsamphold_setup();
  sigrpole_setup();
  sigrzero_setup();
  sigrzero_rev_setup();
  sigcpole_setup();
  sigczero_setup();
  sigczero_rev_setup();
  slop_tilde_setup();
  return;
}

Assistant:

void d_filter_setup(void)
{
    sighip_setup();
    siglop_setup();
    sigbp_setup();
    sigbiquad_setup();
    sigsamphold_setup();
    sigrpole_setup();
    sigrzero_setup();
    sigrzero_rev_setup();
    sigcpole_setup();
    sigczero_setup();
    sigczero_rev_setup();
    slop_tilde_setup();
}